

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadlocal-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase33::run(TestCase33 *this)

{
  uint *local_b8;
  bool local_ae;
  bool local_ad;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  Type local_a0;
  Function<void_()> local_88;
  Thread local_78;
  bool local_5d;
  uint local_5c;
  bool threadDone;
  void *pvStack_58;
  uint j;
  bool local_49;
  uint *puStack_48;
  bool _kj_shouldLog_3;
  bool local_3d;
  uint local_3c;
  bool _kj_shouldLog_2;
  void *pvStack_38;
  uint i;
  bool local_29;
  void *pvStack_28;
  bool _kj_shouldLog_1;
  bool local_19;
  uint *puStack_18;
  bool _kj_shouldLog;
  uint *p;
  TestCase33 *this_local;
  
  p = (uint *)this;
  puStack_18 = _::ThreadLocalPtr::operator_cast_to_unsigned_int_
                         ((ThreadLocalPtr *)&(anonymous_namespace)::tls1);
  if (puStack_18 != (uint *)0x0) {
    local_19 = _::Debug::shouldLog(ERROR);
    while (local_19 != false) {
      pvStack_28 = (void *)0x0;
      _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                 ,0x24,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
                 (char (*) [34])"failed: expected (nullptr) == (p)",&stack0xffffffffffffffd8,
                 &stack0xffffffffffffffe8);
      local_19 = false;
    }
  }
  puStack_18 = _::ThreadLocalPtr::operator_cast_to_unsigned_int_
                         ((ThreadLocalPtr *)&(anonymous_namespace)::tls2);
  if (puStack_18 != (uint *)0x0) {
    local_29 = _::Debug::shouldLog(ERROR);
    while (local_29 != false) {
      pvStack_38 = (void *)0x0;
      _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                 ,0x26,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
                 (char (*) [34])"failed: expected (nullptr) == (p)",&stack0xffffffffffffffc8,
                 &stack0xffffffffffffffe8);
      local_29 = false;
    }
  }
  local_3c = 0x7b;
  _::ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>::
  operator=((ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
             *)&(anonymous_namespace)::tls1,&local_3c);
  puStack_18 = _::ThreadLocalPtr::operator_cast_to_unsigned_int_
                         ((ThreadLocalPtr *)&(anonymous_namespace)::tls1);
  if (&local_3c != puStack_18) {
    local_3d = _::Debug::shouldLog(ERROR);
    while (local_3d != false) {
      puStack_48 = &local_3c;
      _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"(&i) == (p)\", &i, p",
                 (char (*) [29])"failed: expected (&i) == (p)",&stack0xffffffffffffffb8,
                 &stack0xffffffffffffffe8);
      local_3d = false;
    }
  }
  puStack_18 = _::ThreadLocalPtr::operator_cast_to_unsigned_int_
                         ((ThreadLocalPtr *)&(anonymous_namespace)::tls2);
  if (puStack_18 != (uint *)0x0) {
    local_49 = _::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      pvStack_58 = (void *)0x0;
      _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                 ,0x2f,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
                 (char (*) [34])"failed: expected (nullptr) == (p)",&stack0xffffffffffffffa8,
                 &stack0xffffffffffffffe8);
      local_49 = false;
    }
  }
  local_5c = 0x1c8;
  local_5d = false;
  local_a0.p = &stack0xffffffffffffffe8;
  local_a0.j = &local_5c;
  local_a0.threadDone = &local_5d;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase33::run()::__0>
            ((Function<void()> *)&local_88,&local_a0);
  Thread::Thread(&local_78,&local_88);
  Thread::~Thread(&local_78);
  Function<void_()>::~Function(&local_88);
  if ((local_5d & 1U) == 0) {
    local_ad = _::Debug::shouldLog(ERROR);
    while (local_ad != false) {
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                 ,0x3d,ERROR,"\"failed: expected \" \"threadDone\"",
                 (char (*) [28])"failed: expected threadDone");
      local_ad = false;
    }
  }
  puStack_18 = _::ThreadLocalPtr::operator_cast_to_unsigned_int_
                         ((ThreadLocalPtr *)&(anonymous_namespace)::tls1);
  if (&local_3c != puStack_18) {
    local_ae = _::Debug::shouldLog(ERROR);
    while (local_ae != false) {
      local_b8 = &local_3c;
      _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                 ,0x41,ERROR,"\"failed: expected \" \"(&i) == (p)\", &i, p",
                 (char (*) [29])"failed: expected (&i) == (p)",&local_b8,&stack0xffffffffffffffe8);
      local_ae = false;
    }
  }
  return;
}

Assistant:

TEST(ThreadLocal, Basic) {
  // Verify that both started out null.
  uint* p = tls1;
  EXPECT_EQ(nullptr, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Set tls1, then verify that only tls1 changed, not tls2.
  uint i = 123;
  tls1 = &i;

  p = tls1;
  EXPECT_EQ(&i, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Check that in another thread, tls1 starts null but can be changed.
  uint j = 456;
  bool threadDone = false;
  Thread([&]() {
    p = tls1;
    EXPECT_EQ(nullptr, p);
    tls1 = &j;

    p = tls1;
    EXPECT_EQ(&j, p);
    threadDone = true;
  });
  EXPECT_TRUE(threadDone);

  // tls1 didn't change in this thread.
  p = tls1;
  EXPECT_EQ(&i, p);
}